

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O0

void __thiscall
Sudoku::FurtherWays::addWay
          (FurtherWays *this,int index,int posX,int posY,int posZ,int value,Reason reason)

{
  undefined1 local_3c [8];
  Way way;
  int value_local;
  int posZ_local;
  int posY_local;
  int posX_local;
  int index_local;
  FurtherWays *this_local;
  
  way.posZ = reason;
  local_3c._0_4_ = index;
  local_3c._4_4_ = posX;
  way.index = posY;
  way.posX = posZ;
  way.posY = value;
  way.value = value;
  way.reason = posZ;
  std::
  set<Sudoku::FurtherWays::Way,_std::less<Sudoku::FurtherWays::Way>,_std::allocator<Sudoku::FurtherWays::Way>_>
  ::insert(&this->ways,(value_type *)local_3c);
  return;
}

Assistant:

void Sudoku::FurtherWays::addWay(int index, int posX, int posY, int posZ, int value, Sudoku::FurtherWays::Reason reason)
{
  Way way;
  way.index = index;
  way.posX = posX;
  way.posY = posY;
  way.posZ = posZ;
  way.value = value;
  way.reason = reason;
  ways.insert(way);
}